

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::TiledOutputFile::Data::Data(Data *this,int numThreads)

{
  _Rb_tree_header *p_Var1;
  _Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
  *this_00;
  TileBuffer **__first;
  allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*> *extraout_RDX;
  size_t __n;
  size_t extraout_RDX_00;
  size_type __len;
  unsigned_long __n_00;
  V2f local_38;
  
  local_38.x = 0.0;
  local_38.y = 0.0;
  Header::Header(&this->header,0x40,0x40,1.0,&local_38,1.0,INCREASING_Y,ZIP_COMPRESSION);
  this->multipart = false;
  (this->tileDesc).xSize = 0x20;
  (this->tileDesc).ySize = 0x20;
  (this->tileDesc).mode = ONE_LEVEL;
  (this->tileDesc).roundingMode = ROUND_DOWN;
  p_Var1 = &(this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->numXTiles = (int *)0x0;
  this->numYTiles = (int *)0x0;
  TileOffsets::TileOffsets(&this->tileOffsets,ONE_LEVEL,0,0,(int *)0x0,(int *)0x0);
  (this->slices).
  super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->slices).
  super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->slices).
  super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tileBuffers).
  super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tileBuffers).
  super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tileBuffers).
  super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->tileOffsetsPosition = 0;
  p_Var1 = &(this->tileMap)._M_t._M_impl.super__Rb_tree_header;
  (this->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->nextTileToWrite).lx = 0;
  (this->nextTileToWrite).ly = 0;
  (this->tileMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->nextTileToWrite).dx = 0;
  (this->nextTileToWrite).dy = 0;
  this->partNumber = -1;
  __n_00 = 1;
  if (1 < numThreads * 2) {
    __n_00 = (unsigned_long)(uint)(numThreads * 2);
  }
  __first = (TileBuffer **)operator_new(__n_00 * 8);
  std::
  __uninitialized_default_n_a<Imf_3_4::(anonymous_namespace)::TileBuffer**,unsigned_long,Imf_3_4::(anonymous_namespace)::TileBuffer*>
            (__first,__n_00,extraout_RDX);
  this_00 = (_Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
             *)(this->tileBuffers).
               super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(this->tileBuffers).
              super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)this_00;
  if (0 < (long)__n) {
    memmove(__first,this_00,__n);
    __n = extraout_RDX_00;
  }
  std::
  _Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
  ::_M_deallocate(this_00,(pointer)((long)(this->tileBuffers).
                                          super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)this_00 >> 3),__n);
  (this->tileBuffers).
  super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_start = __first;
  (this->tileBuffers).
  super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = __first + __n_00;
  (this->tileBuffers).
  super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = __first + __n_00;
  return;
}

Assistant:

TiledOutputFile::Data::Data (int numThreads)
    : multipart (false)
    , numXTiles (0)
    , numYTiles (0)
    , tileOffsetsPosition (0)
    , partNumber (-1)
{
    //
    // We need at least one tileBuffer, but if threading is used,
    // to keep n threads busy we need 2*n tileBuffers
    //

    tileBuffers.resize (max (1, 2 * numThreads));
}